

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O1

void __thiscall QFormLayoutPrivate::updateSizes(QFormLayoutPrivate *this)

{
  QLayout *this_00;
  QFormLayoutItem *item;
  QFormLayoutItem *item_00;
  byte bVar1;
  bool bVar2;
  RowWrapPolicy RVar3;
  FieldGrowthPolicy FVar4;
  uint uVar5;
  int iVar6;
  QFlagsStorage<QSizePolicy::ControlType> controls1;
  int iVar7;
  QWidget *this_01;
  pointer ppQVar8;
  uint uVar9;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  QFormLayoutItem *pQVar13;
  QFormLayoutItem *pQVar14;
  long lVar15;
  QFlagsStorage<QSizePolicy::ControlType> local_a0;
  uint local_98;
  QFlagsStorage<QSizePolicy::ControlType> local_94;
  QFlagsStorage<QSizePolicy::ControlType> local_90;
  QFlagsStorage<QSizePolicy::ControlType> local_8c;
  QStyle *local_80;
  uint local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  
  if ((this->field_0xb2 & 0x30) != 0) {
    this_00 = *(QLayout **)&(this->super_QLayoutPrivate).field_0x8;
    RVar3 = QFormLayout::rowWrapPolicy((QFormLayout *)this_00);
    uVar12 = (this->m_matrix).m_storage.d.size;
    this->field_0xb2 = this->field_0xb2 & 0xfc;
    this_01 = QLayout::parentWidget(this_00);
    if (this_01 == (QWidget *)0x0) {
      local_80 = (QStyle *)0x0;
    }
    else {
      local_80 = QWidget::style(this_01);
    }
    local_98 = *(uint *)(*(long *)&this_00->field_0x8 + 0x164);
    if ((int)local_98 < 0) {
      local_98 = qSmartSpacing(this_00,PM_LayoutVerticalSpacing);
    }
    local_6c = 0;
    local_74 = 0;
    if ((RVar3 != WrapAllRows) &&
       (local_74 = *(uint *)(*(long *)&this_00->field_0x8 + 0x160), (int)local_74 < 0)) {
      local_74 = qSmartSpacing(this_00,PM_LayoutHorizontalSpacing);
    }
    local_68 = 0;
    local_70 = 0;
    local_64 = 0;
    local_5c = 0;
    local_60 = 0;
    uVar5 = 0;
    uVar9 = 0;
    uVar11 = (uint)(uVar12 >> 1);
    if (0 < (int)uVar11) {
      uVar12 = (ulong)(uVar11 & 0x7fffffff);
      lVar15 = 0;
      bVar1 = 0;
      bVar10 = 0;
      pQVar14 = (QFormLayoutItem *)0x0;
      pQVar13 = (QFormLayoutItem *)0x0;
      local_60 = 0;
      local_5c = 0;
      local_64 = 0;
      local_70 = 0;
      local_68 = 0;
      local_6c = 0;
      do {
        ppQVar8 = QList<QFormLayoutItem_*>::data(&(this->m_matrix).m_storage);
        item = *(QFormLayoutItem **)((long)ppQVar8 + lVar15);
        ppQVar8 = QList<QFormLayoutItem_*>::data(&(this->m_matrix).m_storage);
        item_00 = *(QFormLayoutItem **)((long)ppQVar8 + lVar15 + 8);
        if (item != (QFormLayoutItem *)0x0 || item_00 != (QFormLayoutItem *)0x0) {
          if (item != (QFormLayoutItem *)0x0) {
            FVar4 = QFormLayout::fieldGrowthPolicy((QFormLayout *)this_00);
            updateFormLayoutItem(item,local_98,FVar4,false);
            if (item->isHfw == true) {
              *(uint *)&this->field_0xb0 = *(uint *)&this->field_0xb0 & 0xfffcffff | 0x10000;
            }
            uVar5 = (*item->item->_vptr_QLayoutItem[5])();
            if ((uVar5 & 2) != 0) {
              bVar10 = 1;
            }
            if ((uVar5 & 1) != 0) {
              bVar1 = 1;
            }
          }
          if (item_00 != (QFormLayoutItem *)0x0) {
            FVar4 = QFormLayout::fieldGrowthPolicy((QFormLayout *)this_00);
            if (item == (QFormLayoutItem *)0x0) {
              updateFormLayoutItem(item_00,local_98,FVar4,item_00->fullRow);
              uVar5 = 0;
              if (item_00->fullRow == false) goto LAB_0039f897;
            }
            else {
              updateFormLayoutItem(item_00,local_98,FVar4,false);
LAB_0039f897:
              uVar5 = local_74;
            }
            item_00->sbsHSpace = uVar5;
            if (item_00->isHfw == true) {
              *(uint *)&this->field_0xb0 = *(uint *)&this->field_0xb0 & 0xfffcffff | 0x10000;
            }
            uVar5 = (*item_00->item->_vptr_QLayoutItem[5])();
            if ((uVar5 & 2) != 0) {
              bVar10 = 1;
            }
            if ((uVar5 & 1) != 0) {
              bVar1 = 1;
            }
          }
          if (local_80 != (QStyle *)0x0 && (int)(local_74 | local_98) < 0) {
            local_8c.i = 1;
            local_90.i = 1;
            if (item != (QFormLayoutItem *)0x0) {
              local_90.i = (*item->item->_vptr_QLayoutItem[0x10])();
            }
            if (item_00 != (QFormLayoutItem *)0x0) {
              local_8c.i = (*item_00->item->_vptr_QLayoutItem[0x10])();
            }
            if ((int)local_98 < 0) {
              if (RVar3 == WrapAllRows) {
                if (pQVar13 != (QFormLayoutItem *)0x0) {
                  pQVar14 = pQVar13;
                }
                pQVar13 = pQVar14;
                if (item != (QFormLayoutItem *)0x0) {
                  pQVar13 = item;
                }
                local_a0.i = 1;
                controls1.i = 1;
                if (pQVar14 != (QFormLayoutItem *)0x0) {
                  controls1.i = (*pQVar14->item->_vptr_QLayoutItem[0x10])();
                }
                if (pQVar13 != (QFormLayoutItem *)0x0) {
                  local_a0.i = (*pQVar13->item->_vptr_QLayoutItem[0x10])();
                }
                if (item != (QFormLayoutItem *)0x0 && pQVar14 != (QFormLayoutItem *)0x0) {
                  iVar6 = QStyle::combinedLayoutSpacing
                                    (local_80,(ControlTypes)controls1.i,(ControlTypes)local_90.i,
                                     Vertical,(QStyleOption *)0x0,this_01);
                  item->vSpace = iVar6;
                }
                if ((item_00 != (QFormLayoutItem *)0x0) && (pQVar13 != (QFormLayoutItem *)0x0)) {
LAB_0039fb97:
                  iVar6 = QStyle::combinedLayoutSpacing
                                    (local_80,(ControlTypes)local_a0.i,(ControlTypes)local_8c.i,
                                     Vertical,(QStyleOption *)0x0,this_01);
LAB_0039fbb6:
                  item_00->vSpace = iVar6;
                }
              }
              else {
                if (pQVar14 == (QFormLayoutItem *)0x0) {
                  pQVar14 = pQVar13;
                }
                local_a0.i = 1;
                local_94.i = 1;
                if (pQVar14 != (QFormLayoutItem *)0x0) {
                  local_94.i = (*pQVar14->item->_vptr_QLayoutItem[0x10])();
                }
                if (pQVar13 != (QFormLayoutItem *)0x0) {
                  local_a0.i = (*pQVar13->item->_vptr_QLayoutItem[0x10])();
                }
                if ((item != (QFormLayoutItem *)0x0) &&
                   (bVar2 = QFormLayoutItem::isHidden(item), !bVar2)) {
                  iVar6 = QStyle::combinedLayoutSpacing
                                    (local_80,(ControlTypes)local_94.i,(ControlTypes)local_90.i,
                                     Vertical,(QStyleOption *)0x0,this_01);
                  if ((item_00 == (QFormLayoutItem *)0x0) &&
                     (iVar7 = QStyle::combinedLayoutSpacing
                                        (local_80,(ControlTypes)local_a0.i,(ControlTypes)local_90.i,
                                         Vertical,(QStyleOption *)0x0,this_01), iVar6 <= iVar7)) {
                    iVar6 = iVar7;
                  }
                  item->vSpace = iVar6;
                }
                if ((item_00 != (QFormLayoutItem *)0x0) &&
                   (bVar2 = QFormLayoutItem::isHidden(item_00), !bVar2)) {
                  if (item != (QFormLayoutItem *)0x0) goto LAB_0039fb97;
                  iVar7 = QStyle::combinedLayoutSpacing
                                    (local_80,(ControlTypes)local_94.i,(ControlTypes)local_8c.i,
                                     Vertical,(QStyleOption *)0x0,this_01);
                  iVar6 = QStyle::combinedLayoutSpacing
                                    (local_80,(ControlTypes)local_a0.i,(ControlTypes)local_8c.i,
                                     Vertical,(QStyleOption *)0x0,this_01);
                  if (iVar6 < iVar7) {
                    iVar6 = iVar7;
                  }
                  goto LAB_0039fbb6;
                }
              }
            }
            if ((int)local_74 < 0 && RVar3 != WrapAllRows) {
              if (item == (QFormLayoutItem *)0x0) {
                if ((~item_00->fullRow & item_00 != (QFormLayoutItem *)0x0) != 0) goto LAB_0039f95b;
              }
              else if (item_00 != (QFormLayoutItem *)0x0) {
LAB_0039f95b:
                iVar6 = QStyle::combinedLayoutSpacing
                                  (local_80,(ControlTypes)0x40,(ControlTypes)0x100,Horizontal,
                                   (QStyleOption *)0x0,this_01);
                item_00->sbsHSpace = iVar6;
              }
            }
          }
          if (item != (QFormLayoutItem *)0x0) {
            iVar6 = (item->minSize).wd.m_i;
            if (local_60 <= iVar6) {
              local_60 = iVar6;
            }
            iVar6 = (item->sizeHint).wd.m_i;
            if (local_5c <= iVar6) {
              local_5c = iVar6;
            }
          }
          pQVar13 = item_00;
          pQVar14 = item;
          if (item_00 != (QFormLayoutItem *)0x0) {
            iVar6 = (item_00->minSize).wd.m_i;
            if (item_00->fullRow == true) {
              if (local_68 <= iVar6) {
                local_68 = iVar6;
              }
              iVar6 = (item_00->sizeHint).wd.m_i;
              if (local_6c <= iVar6) {
                local_6c = iVar6;
              }
            }
            else {
              iVar6 = iVar6 + item_00->sbsHSpace;
              if (local_64 <= iVar6) {
                local_64 = iVar6;
              }
              iVar6 = item_00->sbsHSpace + (item_00->sizeHint).wd.m_i;
              if (local_70 <= iVar6) {
                local_70 = iVar6;
              }
            }
          }
        }
        lVar15 = lVar15 + 0x10;
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
      uVar5 = (uint)bVar10 << 0x16;
      uVar9 = (uint)bVar1 << 0x17;
    }
    if (RVar3 == WrapAllRows) {
      if (local_70 < local_6c) {
        local_70 = local_6c;
      }
      if (local_70 < local_5c) {
        local_70 = local_5c;
      }
      this->sh_width = local_70;
      if (local_64 < local_68) {
        local_64 = local_68;
      }
      if (local_64 < local_60) {
        local_64 = local_60;
      }
      this->min_width = local_64;
      local_5c = 0;
    }
    else {
      iVar6 = local_70 + local_5c;
      if (local_70 + local_5c <= local_6c) {
        iVar6 = local_6c;
      }
      this->sh_width = iVar6;
      if (RVar3 == DontWrapRows) {
        iVar6 = local_64 + local_60;
        if (local_64 + local_60 <= local_68) {
          iVar6 = local_68;
        }
        this->min_width = iVar6;
        local_5c = 0xffffff;
      }
      else {
        if (local_68 <= local_64) {
          local_68 = local_64;
        }
        if (local_68 < local_60) {
          local_68 = local_60;
        }
        this->min_width = local_68;
        local_5c = local_5c + local_64;
      }
    }
    this->thresh_width = local_5c;
    *(uint *)&this->field_0xb0 = uVar5 | uVar9 | *(uint *)&this->field_0xb0 & 0xff3fffff;
  }
  this->field_0xb2 = this->field_0xb2 & 0xcf;
  return;
}

Assistant:

void QFormLayoutPrivate::updateSizes()
{
    Q_Q(QFormLayout);

    if (sizesDirty) {
        QFormLayout::RowWrapPolicy wrapPolicy = q->rowWrapPolicy();
        bool wrapAllRows = (wrapPolicy == QFormLayout::WrapAllRows);
        bool dontWrapRows = (wrapPolicy == QFormLayout::DontWrapRows);
        int rr = m_matrix.rowCount();

        has_hfw = false;

        // If any control can expand, so can this layout
        // Wrapping doesn't affect expansion, though, just the minsize
        bool expandH = false;
        bool expandV = false;

        QFormLayoutItem *prevLbl = nullptr;
        QFormLayoutItem *prevFld = nullptr;

        QWidget *parent = q->parentWidget();
        QStyle *style = parent ? parent->style() : nullptr;

        int userVSpacing = q->verticalSpacing();
        int userHSpacing = wrapAllRows ? 0 : q->horizontalSpacing();

        int maxMinLblWidth = 0;
        int maxMinFldWidth = 0; // field with label
        int maxMinIfldWidth = 0; // independent field

        int maxShLblWidth = 0;
        int maxShFldWidth = 0;
        int maxShIfldWidth = 0;

        for (int i = 0; i < rr; ++i) {
            QFormLayoutItem *label = m_matrix(i, 0);
            QFormLayoutItem *field = m_matrix(i, 1);

            // Skip empty rows
            if (!label && !field)
                continue;

            if (label) {
                updateFormLayoutItem(label, userVSpacing, q->fieldGrowthPolicy(), false);
                if (label->isHfw)
                    has_hfw = true;
                Qt::Orientations o = label->expandingDirections();

                if (o & Qt::Vertical)
                    expandV = true;
                if (o & Qt::Horizontal)
                    expandH = true;
            }
            if (field) {
                updateFormLayoutItem(field, userVSpacing, q->fieldGrowthPolicy(), !label && field->fullRow);
                field->sbsHSpace = (!label && field->fullRow) ? 0 : userHSpacing;
                if (field->isHfw)
                    has_hfw = true;

                Qt::Orientations o = field->expandingDirections();

                if (o & Qt::Vertical)
                    expandV = true;
                if (o & Qt::Horizontal)
                    expandH = true;
            }

            // See if we need to calculate default spacings
            if ((userHSpacing < 0 || userVSpacing < 0) && style) {
                QSizePolicy::ControlTypes lbltypes =
                    QSizePolicy::ControlTypes(label ? label->controlTypes() : QSizePolicy::DefaultType);
                QSizePolicy::ControlTypes fldtypes =
                    QSizePolicy::ControlTypes(field ? field->controlTypes() : QSizePolicy::DefaultType);

                // VSpacing
                if (userVSpacing < 0) {
                    if (wrapAllRows) {
                        // label spacing is to a previous item
                        QFormLayoutItem *lbltop = prevFld ? prevFld : prevLbl;
                        // field spacing is to the label (or a previous item)
                        QFormLayoutItem *fldtop = label ? label : lbltop;
                        QSizePolicy::ControlTypes lbltoptypes =
                            QSizePolicy::ControlTypes(lbltop ? lbltop->controlTypes() : QSizePolicy::DefaultType);
                        QSizePolicy::ControlTypes fldtoptypes =
                            QSizePolicy::ControlTypes(fldtop ? fldtop->controlTypes() : QSizePolicy::DefaultType);
                        if (label && lbltop)
                            label->vSpace = style->combinedLayoutSpacing(lbltoptypes, lbltypes, Qt::Vertical, nullptr, parent);
                        if (field && fldtop)
                            field->vSpace = style->combinedLayoutSpacing(fldtoptypes, fldtypes, Qt::Vertical, nullptr, parent);
                    } else {
                        // Side by side..  we have to also consider the spacings to empty cells, which can strangely be more than
                        // non empty cells..
                        QFormLayoutItem *lbltop = prevLbl ? prevLbl : prevFld;
                        QFormLayoutItem *fldtop = prevFld;
                        QSizePolicy::ControlTypes lbltoptypes =
                            QSizePolicy::ControlTypes(lbltop ? lbltop->controlTypes() : QSizePolicy::DefaultType);
                        QSizePolicy::ControlTypes fldtoptypes =
                            QSizePolicy::ControlTypes(fldtop ? fldtop->controlTypes() : QSizePolicy::DefaultType);

                        // To be compatible to QGridLayout, we have to compare solitary labels & fields with both predecessors
                        if (label && !label->isHidden()) {
                            if (!field) {
                                int lblspacing = style->combinedLayoutSpacing(lbltoptypes, lbltypes, Qt::Vertical, nullptr, parent);
                                int fldspacing = style->combinedLayoutSpacing(fldtoptypes, lbltypes, Qt::Vertical, nullptr, parent);
                                label->vSpace = qMax(lblspacing, fldspacing);
                            } else {
                                label->vSpace = style->combinedLayoutSpacing(lbltoptypes, lbltypes, Qt::Vertical, nullptr, parent);
                            }
                        }

                        if (field && !field->isHidden()) {
                            // check spacing against both the previous label and field
                            if (!label) {
                                int lblspacing = style->combinedLayoutSpacing(lbltoptypes, fldtypes, Qt::Vertical, nullptr, parent);
                                int fldspacing = style->combinedLayoutSpacing(fldtoptypes, fldtypes, Qt::Vertical, nullptr, parent);
                                field->vSpace = qMax(lblspacing, fldspacing);
                            } else {
                                field->vSpace = style->combinedLayoutSpacing(fldtoptypes, fldtypes, Qt::Vertical, nullptr, parent);
                            }
                        }
                    }
                }

                // HSpacing
                // hard-coded the left and right control types so that all the rows have the same
                // inter-column spacing (otherwise the right column isn't always left aligned)
                if (userHSpacing < 0 && !wrapAllRows && (label || !field->fullRow) && field)
                    field->sbsHSpace = style->combinedLayoutSpacing(QSizePolicy::Label, QSizePolicy::LineEdit, Qt::Horizontal, nullptr, parent);
            }

            // Now update our min/sizehint widths
            // We choose to put the spacing in the field side in sbs, so
            // the right edge of the labels will align, but fields may
            // be a little ragged.. since different controls may have
            // different appearances, a slight raggedness in the left
            // edges of fields can be tolerated.
            // (Note - field->sbsHSpace is 0 for WrapAllRows mode)
            if (label) {
                maxMinLblWidth = qMax(maxMinLblWidth, label->minSize.width());
                maxShLblWidth = qMax(maxShLblWidth, label->sizeHint.width());
            }
            if (field) {
                if (field->fullRow) {
                    maxMinIfldWidth = qMax(maxMinIfldWidth, field->minSize.width());
                    maxShIfldWidth = qMax(maxShIfldWidth, field->sizeHint.width());
                } else {
                    maxMinFldWidth = qMax(maxMinFldWidth, field->minSize.width() + field->sbsHSpace);
                    maxShFldWidth = qMax(maxShFldWidth, field->sizeHint.width() + field->sbsHSpace);
                }
            }

            prevLbl = label;
            prevFld = field;
        }

        // Now, finally update the min/sizeHint widths
        if (wrapAllRows) {
            sh_width = qMax(maxShLblWidth, qMax(maxShIfldWidth, maxShFldWidth));
            min_width = qMax(maxMinLblWidth, qMax(maxMinIfldWidth, maxMinFldWidth));
            // in two line, we don't care as much about the threshold width
            thresh_width = 0;
        } else if (dontWrapRows) {
            // This is just the max widths glommed together
            sh_width = qMax(maxShLblWidth + maxShFldWidth, maxShIfldWidth);
            min_width = qMax(maxMinLblWidth + maxMinFldWidth, maxMinIfldWidth);
            thresh_width = QWIDGETSIZE_MAX;
        } else {
            // This is just the max widths glommed together
            sh_width = qMax(maxShLblWidth + maxShFldWidth, maxShIfldWidth);
            // min width needs to be the min when everything is wrapped,
            // otherwise we'll never get set with a width that causes wrapping
            min_width = qMax(maxMinLblWidth, qMax(maxMinIfldWidth, maxMinFldWidth));
            // We split a pair at label sh + field min (### for now..)
            thresh_width = maxShLblWidth + maxMinFldWidth;
        }

        // Update the expansions
        expandVertical = expandV;
        expandHorizontal = expandH;
    }
    sizesDirty = false;
}